

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

Am_Explicit_Set * Am_Explicit_Set::Narrow(Am_Constraint *formula)

{
  uint uVar1;
  uint uVar2;
  Am_Constraint *formula_local;
  
  uVar1 = (uint)id;
  uVar2 = (**(formula->super_Am_Registered_Type)._vptr_Am_Registered_Type)();
  if (uVar1 == (uVar2 & 0xffff)) {
    return (Am_Explicit_Set *)formula;
  }
  Am_Error("Constraint narrowed to Explicit_Set type is not an Explicit_Set.");
}

Assistant:

Am_Explicit_Set *
Am_Explicit_Set::Narrow(Am_Constraint *formula)
{
  if (id == formula->ID())
    return (Am_Explicit_Set *)formula;
  else {
    Am_Error(
        "Constraint narrowed to Explicit_Set type is not an Explicit_Set.");
    return nullptr;
  }
}